

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::SumPropagateStats
          (duckdb *this,ClientContext *context,BoundAggregateExpression *expr,
          AggregateStatisticsInput *input)

{
  optional_ptr<duckdb::NodeStatistics,_true> *this_00;
  value_type type;
  char cVar1;
  int iVar2;
  reference pvVar3;
  long lVar4;
  InternalException *this_01;
  hugeint_t max_sum_negative;
  hugeint_t max_positive;
  hugeint_t max_negative;
  hugeint_t max_sum_positive;
  hugeint_t local_1b8;
  hugeint_t local_1a8;
  hugeint_t local_198;
  AggregateFunction local_180;
  hugeint_t local_50;
  hugeint_t local_40;
  
  local_180._8_8_ = local_180._0_8_;
  if (*(long *)(input + 0x10) != 0) {
    this_00 = (optional_ptr<duckdb::NodeStatistics,_true> *)(input + 0x10);
    optional_ptr<duckdb::NodeStatistics,_true>::CheckValid(this_00);
    if (*(char *)(*(long *)this_00 + 0x10) == '\x01') {
      pvVar3 = vector<duckdb::BaseStatistics,_true>::operator[]
                         (*(vector<duckdb::BaseStatistics,_true> **)(input + 8),0);
      cVar1 = duckdb::NumericStats::HasMinMax(pvVar3);
      if (cVar1 != '\0') {
        type = pvVar3[1];
        if (type == (value_type)0x9) {
          duckdb::NumericStats::Min((BaseStatistics *)&local_180);
          lVar4 = duckdb::Value::GetValueUnsafe<long>();
          duckdb::hugeint_t::hugeint_t(&local_1b8,lVar4);
          local_198.lower = local_1b8.lower;
          local_198.upper = local_1b8.upper;
          duckdb::Value::~Value((Value *)&local_180);
          duckdb::NumericStats::Max((BaseStatistics *)&local_180);
          lVar4 = duckdb::Value::GetValueUnsafe<long>();
          duckdb::hugeint_t::hugeint_t(&local_1b8,lVar4);
        }
        else {
          if (type != (value_type)0x7) {
            this_01 = (InternalException *)__cxa_allocate_exception(0x10);
            local_180._0_8_ = (long)&local_180 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_180,"Unsupported type for propagate sum stats","");
            duckdb::InternalException::InternalException(this_01,(string *)&local_180);
            __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
          }
          duckdb::NumericStats::Min((BaseStatistics *)&local_180);
          iVar2 = duckdb::Value::GetValueUnsafe<int>();
          duckdb::hugeint_t::hugeint_t(&local_1b8,(long)iVar2);
          local_198.lower = local_1b8.lower;
          local_198.upper = local_1b8.upper;
          duckdb::Value::~Value((Value *)&local_180);
          duckdb::NumericStats::Max((BaseStatistics *)&local_180);
          iVar2 = duckdb::Value::GetValueUnsafe<int>();
          duckdb::hugeint_t::hugeint_t(&local_1b8,(long)iVar2);
        }
        local_1a8.lower = local_1b8.lower;
        local_1a8.upper = local_1b8.upper;
        duckdb::Value::~Value((Value *)&local_180);
        optional_ptr<duckdb::NodeStatistics,_true>::CheckValid(this_00);
        local_180._0_16_ =
             Hugeint::Convert<unsigned_long>(*(unsigned_long *)(*(long *)this_00 + 0x18));
        local_1b8 = (hugeint_t)duckdb::hugeint_t::operator*(&local_198,(hugeint_t *)&local_180);
        optional_ptr<duckdb::NodeStatistics,_true>::CheckValid(this_00);
        local_180._0_16_ =
             Hugeint::Convert<unsigned_long>(*(unsigned_long *)(*(long *)this_00 + 0x18));
        local_40 = (hugeint_t)duckdb::hugeint_t::operator*(&local_1a8,(hugeint_t *)&local_180);
        duckdb::hugeint_t::hugeint_t((hugeint_t *)&local_180,0x7fffffffffffffff);
        cVar1 = duckdb::hugeint_t::operator>=(&local_40,(hugeint_t *)&local_180);
        if (cVar1 == '\0') {
          duckdb::hugeint_t::hugeint_t(&local_50,-0x8000000000000000);
          cVar1 = duckdb::hugeint_t::operator<=(&local_1b8,&local_50);
          if (cVar1 == '\0') {
            GetSumAggregateNoOverflow(&local_180,(PhysicalType)type);
            AggregateFunction::operator=((AggregateFunction *)(expr + 0x58),&local_180);
            local_180._0_8_ = &PTR__AggregateFunction_00890e90;
            if (local_180.function_info.internal.
                super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_180.function_info.internal.
                         super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            duckdb::BaseScalarFunction::~BaseScalarFunction(&local_180.super_BaseScalarFunction);
          }
        }
      }
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> SumPropagateStats(ClientContext &context, BoundAggregateExpression &expr,
                                             AggregateStatisticsInput &input) {
	if (input.node_stats && input.node_stats->has_max_cardinality) {
		auto &numeric_stats = input.child_stats[0];
		if (!NumericStats::HasMinMax(numeric_stats)) {
			return nullptr;
		}
		auto internal_type = numeric_stats.GetType().InternalType();
		hugeint_t max_negative;
		hugeint_t max_positive;
		switch (internal_type) {
		case PhysicalType::INT32:
			max_negative = NumericStats::Min(numeric_stats).GetValueUnsafe<int32_t>();
			max_positive = NumericStats::Max(numeric_stats).GetValueUnsafe<int32_t>();
			break;
		case PhysicalType::INT64:
			max_negative = NumericStats::Min(numeric_stats).GetValueUnsafe<int64_t>();
			max_positive = NumericStats::Max(numeric_stats).GetValueUnsafe<int64_t>();
			break;
		default:
			throw InternalException("Unsupported type for propagate sum stats");
		}
		auto max_sum_negative = max_negative * Hugeint::Convert(input.node_stats->max_cardinality);
		auto max_sum_positive = max_positive * Hugeint::Convert(input.node_stats->max_cardinality);
		if (max_sum_positive >= NumericLimits<int64_t>::Maximum() ||
		    max_sum_negative <= NumericLimits<int64_t>::Minimum()) {
			// sum can potentially exceed int64_t bounds: use hugeint sum
			return nullptr;
		}
		// total sum is guaranteed to fit in a single int64: use int64 sum instead of hugeint sum
		expr.function = GetSumAggregateNoOverflow(internal_type);
	}
	return nullptr;
}